

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_manager.cpp
# Opt level: O1

void __thiscall
duckdb::ConnectionManager::AddConnection(ConnectionManager *this,ClientContext *context)

{
  _Atomic_word *p_Var1;
  pointer puVar2;
  int iVar3;
  DatabaseInstance *pDVar4;
  pointer pEVar5;
  mapped_type *pmVar6;
  unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>
  *callback;
  pointer this_00;
  mapped_type local_48;
  enable_shared_from_this<duckdb::ClientContext> local_38;
  key_type local_28;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 == 0) {
    pDVar4 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&context->db);
    puVar2 = (pDVar4->config).extension_callbacks.
             super_vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (pDVar4->config).extension_callbacks.
                   super_vector<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar2;
        this_00 = this_00 + 1) {
      pEVar5 = unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>
               ::operator->(this_00);
      (**(code **)(*(long *)pEVar5 + 0x10))(pEVar5,context);
    }
    enable_shared_from_this<duckdb::ClientContext>::shared_from_this(&local_38);
    local_48.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_38.__weak_this_.internal.
         super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_48.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         local_38.__weak_this_.internal.
         super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_38.__weak_this_.internal.
        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.__weak_this_.internal.
         super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_weak_count =
             (local_38.__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
             ->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (local_38.__weak_this_.internal.
         super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_weak_count =
             (local_38.__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
             ->_M_weak_count + 1;
      }
    }
    local_28._M_data = context;
    pmVar6 = ::std::__detail::
             _Map_base<std::reference_wrapper<duckdb::ClientContext>,_std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::ClientContext>,_duckdb::ReferenceHashFunction<duckdb::ClientContext>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::reference_wrapper<duckdb::ClientContext>,_std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::ClientContext>,_duckdb::weak_ptr<duckdb::ClientContext,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::ClientContext>,_duckdb::ReferenceHashFunction<duckdb::ClientContext>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->connections,&local_28);
    if (pmVar6 != &local_48) {
      (pmVar6->internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = local_48.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar6->internal).
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &local_48.internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    if (local_48.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_48.internal.
                   super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_weak_count;
        iVar3 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar3 = (local_48.internal.
                 super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_weak_count;
        (local_48.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_weak_count = iVar3 + -1;
      }
      if (iVar3 == 1) {
        (*(local_48.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    if (local_38.__weak_this_.internal.
        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.__weak_this_.internal.
                 super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    LOCK();
    (this->connection_count).super___atomic_base<unsigned_long>._M_i =
         (this->connections)._M_h._M_element_count;
    UNLOCK();
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

void ConnectionManager::AddConnection(ClientContext &context) {
	lock_guard<mutex> lock(connections_lock);
	for (auto &callback : DBConfig::GetConfig(context).extension_callbacks) {
		callback->OnConnectionOpened(context);
	}
	connections[context] = weak_ptr<ClientContext>(context.shared_from_this());
	connection_count = connections.size();
}